

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

ch_primitive ch_vm_call(ch_context *context,ch_string *function_name)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  ch_argcount argcount_00;
  uint *puVar5;
  undefined8 *puVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  _Bool _Var10;
  ch_string *pcVar11;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 aVar12;
  ch_primitive *pcVar13;
  ch_upvalue *pcVar14;
  ch_primitive cVar15;
  ch_primitive cVar16;
  ch_primitive entry_00;
  ch_primitive entry_01;
  ch_primitive entry_02;
  ch_primitive entry_03;
  ch_primitive entry_04;
  ch_primitive entry_05;
  ch_primitive entry_06;
  ch_primitive value_00;
  ch_primitive entry_07;
  ch_primitive entry_08;
  ch_primitive entry_09;
  ch_primitive primitive;
  ch_primitive primitive_00;
  ch_primitive entry_10;
  ch_primitive value_01;
  ch_primitive entry_11;
  ch_primitive value_02;
  ch_primitive peek;
  ch_jmpptr ptr_1;
  undefined1 auStack_280 [4];
  ch_jmpptr ptr;
  ch_primitive returned_value;
  ch_primitive function_3;
  undefined1 local_258 [7];
  ch_argcount argcount_1;
  ch_primitive function_2;
  ch_stack_addr addr;
  uint8_t index_4;
  uint8_t is_local;
  uint8_t i;
  ch_closure *closure;
  ch_function *function_1;
  ch_primitive value_6;
  uint8_t upvalue_count;
  ch_primitive function;
  ch_argcount argcount;
  ch_dataptr function_ptr;
  ch_string *name_1;
  ch_primitive entry_4;
  ch_string *name;
  ch_primitive *closed;
  ch_primitive value_5;
  uint8_t index_3;
  ch_primitive *value_4;
  uint8_t index_2;
  ch_stack_addr index_1;
  uint8_t offset_1;
  ch_primitive entry_3;
  ch_stack_addr index;
  undefined1 local_178 [3];
  uint8_t offset;
  ch_dataptr num_popped;
  ch_primitive entry_2;
  double local_158;
  double value_3;
  ch_primitive entry_1;
  double local_130;
  double value_2;
  ch_primitive entry;
  ch_object *local_108;
  ch_object *object_args [2];
  ch_primitive result;
  ch_primitive args [2];
  anon_union_8_4_dd993ae3_for_ch_primitive_1 local_a8;
  undefined4 local_a0;
  undefined1 local_98;
  undefined7 uStack_97;
  undefined1 local_89;
  undefined4 local_88;
  char value_1;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined4 local_78;
  undefined1 local_70;
  uint7 uStack_6f;
  undefined4 local_68;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 local_60;
  anon_union_8_4_dd993ae3_for_ch_primitive_1 local_58;
  ch_string *string;
  ulong local_48;
  ulong local_40;
  double value;
  size_t sStack_30;
  uint8_t opcode;
  size_t initial_stack_size;
  ch_string *function_name_local;
  ch_context *context_local;
  
  sStack_30 = (context->stack).size;
  initial_stack_size = (size_t)function_name;
  function_name_local = (ch_string *)context;
  while (function_name_local[0x102].size == 0) {
    value._7_1_ = **(byte **)&function_name_local->size;
    *(long *)&function_name_local->size = *(long *)&function_name_local->size + 1;
    switch(value._7_1_) {
    case 0:
      function_name_local[0x102].size = 1;
      break;
    case 1:
      _Var10 = ch_stack_pop((ch_stack *)&function_name_local[1].value,(ch_primitive *)local_178);
      if (!_Var10) {
        halt((ch_context *)function_name_local,EXIT_STACK_EMPTY);
      }
      break;
    case 2:
      *(long *)&function_name_local->size = *(long *)&function_name_local->size + 4;
      ch_stack_popn((ch_stack *)&function_name_local[1].value,
                    *(uint8_t *)(*(long *)&function_name_local->size + -4));
      break;
    case 3:
      ch_stack_copy((ch_stack *)&function_name_local[1].value,
                    (int)*(undefined8 *)(function_name_local + 2) - 1);
      break;
    case 4:
      *(long *)&function_name_local->size = *(long *)&function_name_local->size + 4;
      local_48 = *(ulong *)(*(long *)function_name_local +
                           (ulong)CONCAT13(*(undefined1 *)(*(long *)&function_name_local->size + -1)
                                           ,CONCAT12(*(undefined1 *)
                                                      (*(long *)&function_name_local->size + -2),
                                                     CONCAT11(*(undefined1 *)
                                                               (*(long *)&function_name_local->size
                                                               + -3),*(undefined1 *)
                                                                      (*(long *)&function_name_local
                                                                                 ->size + -4)))));
      string._0_4_ = 0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_48;
      local_40 = local_48;
      _Var10 = ch_stack_push((ch_stack *)&function_name_local[1].value,
                             (ch_primitive)(auVar7 << 0x40));
      if (!_Var10) {
        halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
      }
      break;
    case 5:
      _Var10 = ch_stack_pop((ch_stack *)&function_name_local[1].value,(ch_primitive *)&value_3);
      if (_Var10) {
        value_00._4_4_ = 0;
        value_00.type = value_3._0_4_;
        value_00.field_1 = (anon_union_8_4_dd993ae3_for_ch_primitive_1)entry_1._0_8_;
        _Var10 = ch_checknumber((ch_context *)function_name_local,value_00,&local_158);
        if (_Var10) {
          entry_2.field_1._0_4_ = 0;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = -local_158;
          _Var10 = ch_stack_push((ch_stack *)&function_name_local[1].value,
                                 (ch_primitive)(auVar9 << 0x40));
          if (!_Var10) {
            halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
          }
        }
      }
      else {
        halt((ch_context *)function_name_local,EXIT_STACK_EMPTY);
      }
      break;
    case 6:
    case 8:
    case 10:
    case 0xb:
      binary_op_args((ch_context *)function_name_local,(ch_primitive *)&result.field_1);
      if (result.field_1._0_4_ == args[0].field_1._0_4_) {
        if (result.field_1._0_4_ == 0) {
          pcVar11 = function_name_local + 1;
          cVar15 = binary_op_number((ch_context *)function_name_local,
                                    (ch_primitive *)&result.field_1,(uint)value._7_1_);
          entry_05.field_1 = cVar15.field_1;
          object_args[1]._0_4_ = cVar15.type;
          entry_05._4_4_ = 0;
          entry_05.type = (ch_primitive_type)object_args[1];
          _Var10 = ch_stack_push((ch_stack *)&pcVar11->value,entry_05);
          if (!_Var10) {
            halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
          }
        }
        else if (result.field_1._0_4_ == 3) {
          if (*(int *)args[0]._0_8_ == *(int *)args[1]._0_8_) {
            if (*(int *)args[0]._0_8_ == 4) {
              pcVar11 = function_name_local + 1;
              cVar15 = binary_op_string((ch_context *)function_name_local,&local_108,
                                        (uint)value._7_1_);
              entry_06.field_1 = cVar15.field_1;
              entry.field_1._0_4_ = cVar15.type;
              entry_06._4_4_ = 0;
              entry_06.type = entry.field_1._0_4_;
              _Var10 = ch_stack_push((ch_stack *)&pcVar11->value,entry_06);
              if (!_Var10) {
                halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
              }
            }
            else {
              ch_runtime_error((ch_context *)function_name_local,EXIT_INCORRECT_TYPE,
                               "Cannot apply binary operation to object type: %d",
                               (ulong)*(uint *)args[0]._0_8_);
            }
          }
          else {
            ch_runtime_error((ch_context *)function_name_local,EXIT_INCORRECT_TYPE,
                             "Can only apply binary operator on matching object types.");
          }
        }
        else {
          ch_runtime_error((ch_context *)function_name_local,EXIT_INCORRECT_TYPE,
                           "Cannot apply binary operation to primitive type: %d",
                           (ulong)(uint)result.field_1._0_4_);
        }
      }
      else {
        ch_runtime_error((ch_context *)function_name_local,EXIT_INCORRECT_TYPE,
                         "Can only apply binary operator on matching types.");
      }
      break;
    case 7:
    case 9:
      _Var10 = ch_stack_pop((ch_stack *)&function_name_local[1].value,(ch_primitive *)&value_2);
      if (_Var10) {
        if (value_2._0_4_ == 0) {
          if (value._7_1_ == 7) {
            local_130 = (double)entry._0_8_ + 1.0;
          }
          else {
            local_130 = (double)entry._0_8_ - 1.0;
          }
          entry_1.field_1._0_4_ = 0;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_130;
          _Var10 = ch_stack_push((ch_stack *)&function_name_local[1].value,
                                 (ch_primitive)(auVar8 << 0x40));
          if (!_Var10) {
            halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
          }
        }
        else {
          ch_runtime_error((ch_context *)function_name_local,EXIT_INCORRECT_TYPE,
                           "Expected number for addone, subone op");
        }
      }
      else {
        halt((ch_context *)function_name_local,EXIT_STACK_EMPTY);
      }
      break;
    case 0xc:
      local_60.object_value = &read_string((ch_context *)function_name_local)->object;
      local_68 = 3;
      entry_00.field_1.object_value = local_60.object_value;
      entry_00._0_8_ = 3;
      local_58.object_value = local_60.object_value;
      _Var10 = ch_stack_push((ch_stack *)&function_name_local[1].value,entry_00);
      if (!_Var10) {
        halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
      }
      break;
    case 0xd:
      local_78 = 1;
      local_70 = 0;
      entry_01.field_1.object_value = (ch_object *)((ulong)uStack_6f << 8);
      entry_01._0_8_ = 1;
      _Var10 = ch_stack_push((ch_stack *)&function_name_local[1].value,entry_01);
      if (!_Var10) {
        halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
      }
      break;
    case 0xe:
      local_88 = 1;
      local_80 = 1;
      entry_02.field_1._1_7_ = uStack_7f;
      entry_02.field_1.boolean_value = true;
      entry_02._0_8_ = 1;
      _Var10 = ch_stack_push((ch_stack *)&function_name_local[1].value,entry_02);
      if (!_Var10) {
        halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
      }
      break;
    case 0xf:
      *(long *)&function_name_local->size = *(long *)&function_name_local->size + 1;
      local_98 = *(undefined1 *)(*(long *)&function_name_local->size + -1);
      local_a0 = 4;
      entry_03.field_1._1_7_ = uStack_97;
      entry_03.field_1.boolean_value = (_Bool)local_98;
      entry_03._0_8_ = 4;
      local_89 = local_98;
      _Var10 = ch_stack_push((ch_stack *)&function_name_local[1].value,entry_03);
      if (!_Var10) {
        halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
      }
      break;
    case 0x10:
      pcVar11 = function_name_local + 1;
      memset(&local_a8,0,8);
      entry_04.field_1.number_value = local_a8.number_value;
      entry_04._0_8_ = 2;
      _Var10 = ch_stack_push((ch_stack *)&pcVar11->value,entry_04);
      if (!_Var10) {
        halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
      }
      break;
    case 0x11:
      *(long *)&function_name_local->size = *(long *)&function_name_local->size + 4;
      entry_3.field_1._4_4_ =
           function_name_local[(ulong)(*(int *)&function_name_local[0x102].value - 1) + 2].size +
           (uint)*(byte *)(*(long *)&function_name_local->size + -4);
      ch_stack_copy((ch_stack *)&function_name_local[1].value,entry_3.field_1._4_4_);
      break;
    case 0x12:
      _Var10 = ch_stack_pop((ch_stack *)&function_name_local[1].value,(ch_primitive *)&index_1);
      if (_Var10) {
        *(long *)&function_name_local->size = *(long *)&function_name_local->size + 4;
        entry_11._4_4_ = 0;
        entry_11.type = index_1;
        entry_11.field_1 = (anon_union_8_4_dd993ae3_for_ch_primitive_1)entry_3._0_8_;
        ch_stack_set((ch_stack *)&function_name_local[1].value,
                     function_name_local[(ulong)(*(int *)&function_name_local[0x102].value - 1) + 2]
                     .size + (uint)*(byte *)(*(long *)&function_name_local->size + -4),entry_11);
      }
      else {
        halt((ch_context *)function_name_local,EXIT_STACK_EMPTY);
      }
      break;
    case 0x13:
      *(long *)&function_name_local->size = *(long *)&function_name_local->size + 1;
      puVar5 = *(uint **)(*(long *)(*(long *)(*(long *)(function_name_local +
                                                       (ulong)(*(int *)&function_name_local[0x102].
                                                                        value - 1) + 3) + 0x10) +
                                   (ulong)*(byte *)(*(long *)&function_name_local->size + -1) * 8) +
                         8);
      entry_07._4_4_ = 0;
      entry_07.type = *puVar5;
      entry_07.field_1 =
           (anon_union_8_4_dd993ae3_for_ch_primitive_1)
           (anon_union_8_4_dd993ae3_for_ch_primitive_1)
           ((anon_union_8_4_dd993ae3_for_ch_primitive_1 *)(puVar5 + 2))->object_value;
      _Var10 = ch_stack_push((ch_stack *)&function_name_local[1].value,entry_07);
      if (!_Var10) {
        halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
      }
      break;
    case 0x14:
      *(long *)&function_name_local->size = *(long *)&function_name_local->size + 1;
      value_5.field_1._7_1_ = *(undefined1 *)(*(long *)&function_name_local->size + -1);
      _Var10 = ch_stack_pop((ch_stack *)&function_name_local[1].value,(ch_primitive *)&closed);
      if (_Var10) {
        puVar6 = *(undefined8 **)
                  (*(long *)(*(long *)(*(long *)(function_name_local +
                                                (ulong)(*(int *)&function_name_local[0x102].value -
                                                       1) + 3) + 0x10) +
                            (ulong)(byte)value_5.field_1._7_1_ * 8) + 8);
        *puVar6 = closed;
        puVar6[1] = value_5._0_8_;
      }
      else {
        halt((ch_context *)function_name_local,EXIT_STACK_EMPTY);
      }
      break;
    case 0x15:
      pcVar13 = ch_stack_get((ch_stack *)&function_name_local[1].value,
                             (int)*(undefined8 *)(function_name_local + 2) - 1);
      close_upvalues((ch_context *)function_name_local,pcVar13);
      ch_stack_popn((ch_stack *)&function_name_local[1].value,'\x01');
      break;
    case 0x16:
    case 0x17:
      entry_4.field_1.object_value = &read_string((ch_context *)function_name_local)->object;
      _Var10 = ch_stack_pop((ch_stack *)&function_name_local[1].value,(ch_primitive *)&name_1);
      if (_Var10) {
        value_02._4_4_ = 0;
        value_02.type = (uint)name_1;
        value_02.field_1 = (anon_union_8_4_dd993ae3_for_ch_primitive_1)entry_4._0_8_;
        set_global((ch_context *)function_name_local,(ch_string *)entry_4.field_1.object_value,
                   value_02,value._7_1_ != 0x16);
      }
      else {
        halt((ch_context *)function_name_local,EXIT_STACK_EMPTY);
      }
      break;
    case 0x18:
      pcVar11 = read_string((ch_context *)function_name_local);
      get_global((ch_context *)function_name_local,pcVar11);
      break;
    case 0x19:
      get_global((ch_context *)function_name_local,(ch_string *)initial_stack_size);
      _Var10 = ch_stack_pop((ch_stack *)&function_name_local[1].value,(ch_primitive *)local_258);
      if (_Var10) {
        primitive._4_4_ = 0;
        primitive.type = local_258._0_4_;
        primitive.field_1 = (anon_union_8_4_dd993ae3_for_ch_primitive_1)function_2._0_8_;
        try_call((ch_context *)function_name_local,primitive,(ch_argcount)sStack_30);
      }
      else {
        halt((ch_context *)function_name_local,EXIT_STACK_EMPTY);
      }
      break;
    case 0x1a:
      *(long *)&function_name_local->size = *(long *)&function_name_local->size + 1;
      argcount_00 = *(ch_argcount *)(*(long *)&function_name_local->size + -1);
      _Var10 = ch_stack_pop((ch_stack *)&function_name_local[1].value,
                            (ch_primitive *)&returned_value.field_1);
      if (_Var10) {
        primitive_00._4_4_ = 0;
        primitive_00.type = returned_value.field_1._0_4_;
        primitive_00.field_1 = (anon_union_8_4_dd993ae3_for_ch_primitive_1)function_3._0_8_;
        try_call((ch_context *)function_name_local,primitive_00,argcount_00);
      }
      else {
        halt((ch_context *)function_name_local,EXIT_STACK_EMPTY);
      }
      break;
    case 0x1b:
      call_return((ch_context *)function_name_local);
      break;
    case 0x1c:
      _Var10 = ch_stack_pop((ch_stack *)&function_name_local[1].value,(ch_primitive *)auStack_280);
      if (_Var10) {
        call_return((ch_context *)function_name_local);
        if (*(int *)&function_name_local[0x102].value == 0) {
          *(ulong *)(function_name_local + 0x106) = CONCAT44(ptr,auStack_280);
          function_name_local[0x106].value = (char *)returned_value._0_8_;
        }
        else {
          entry_10._4_4_ = 0;
          entry_10.type = (ch_primitive_type)auStack_280;
          entry_10.field_1 = (anon_union_8_4_dd993ae3_for_ch_primitive_1)returned_value._0_8_;
          _Var10 = ch_stack_push((ch_stack *)&function_name_local[1].value,entry_10);
          if (!_Var10) {
            halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
          }
        }
      }
      else {
        halt((ch_context *)function_name_local,EXIT_STACK_EMPTY);
      }
      break;
    case 0x1d:
      *(long *)&function_name_local->size = *(long *)&function_name_local->size + 4;
      uVar1 = *(undefined1 *)(*(long *)&function_name_local->size + -4);
      uVar2 = *(undefined1 *)(*(long *)&function_name_local->size + -3);
      uVar3 = *(undefined1 *)(*(long *)&function_name_local->size + -2);
      uVar4 = *(undefined1 *)(*(long *)&function_name_local->size + -1);
      cVar15 = ch_stack_peek((ch_stack *)&function_name_local[1].value,0);
      value_01._4_4_ = 0;
      value_01.type = cVar15.type;
      value_01.field_1.number_value = cVar15.field_1.number_value;
      _Var10 = ch_primitive_isfalsy(value_01);
      if (_Var10) {
        jump((ch_context *)function_name_local,CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)))
            );
      }
      break;
    case 0x1e:
      *(long *)&function_name_local->size = *(long *)&function_name_local->size + 4;
      jump((ch_context *)function_name_local,
           CONCAT13(*(undefined1 *)(*(long *)&function_name_local->size + -1),
                    CONCAT12(*(undefined1 *)(*(long *)&function_name_local->size + -2),
                             CONCAT11(*(undefined1 *)(*(long *)&function_name_local->size + -3),
                                      *(undefined1 *)(*(long *)&function_name_local->size + -4)))));
      break;
    case 0x1f:
      *(long *)&function_name_local->size = *(long *)&function_name_local->size + 4;
      uVar1 = *(undefined1 *)(*(long *)&function_name_local->size + -4);
      uVar2 = *(undefined1 *)(*(long *)&function_name_local->size + -3);
      uVar3 = *(undefined1 *)(*(long *)&function_name_local->size + -2);
      uVar4 = *(undefined1 *)(*(long *)&function_name_local->size + -1);
      *(long *)&function_name_local->size = *(long *)&function_name_local->size + 1;
      aVar12.object_value =
           &ch_loadfunction(CONCAT13(uVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1))),
                            *(ch_argcount *)(*(long *)&function_name_local->size + -1))->object;
      entry_08.field_1.object_value = aVar12.object_value;
      entry_08._0_8_ = 3;
      _Var10 = ch_stack_push((ch_stack *)&function_name_local[1].value,entry_08);
      if (!_Var10) {
        halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
      }
      break;
    case 0x20:
      *(long *)&function_name_local->size = *(long *)&function_name_local->size + 1;
      value_6.field_1._7_1_ = *(undefined1 *)(*(long *)&function_name_local->size + -1);
      _Var10 = ch_stack_pop((ch_stack *)&function_name_local[1].value,(ch_primitive *)&function_1);
      if (_Var10) {
        closure = (ch_closure *)0x0;
        cVar15._4_4_ = 0;
        cVar15.type = (uint)function_1;
        cVar15.field_1 = (anon_union_8_4_dd993ae3_for_ch_primitive_1)value_6._0_8_;
        _Var10 = ch_checkfunction((ch_context *)function_name_local,cVar15,(ch_function **)&closure)
        ;
        if (_Var10) {
          aVar12.object_value =
               &ch_loadclosure((ch_function *)closure,value_6.field_1._7_1_)->object;
          entry_09.field_1.object_value = aVar12.object_value;
          entry_09._0_8_ = 3;
          _Var10 = ch_stack_push((ch_stack *)&function_name_local[1].value,entry_09);
          if (_Var10) {
            for (function_2.field_1._7_1_ = 0; pcVar11 = function_name_local,
                (byte)function_2.field_1._7_1_ < (byte)value_6.field_1._7_1_;
                function_2.field_1._7_1_ = function_2.field_1._7_1_ + '\x01') {
              *(long *)&function_name_local->size = *(long *)&function_name_local->size + 1;
              function_2.field_1._6_1_ = *(char *)(*(long *)&function_name_local->size + -1);
              *(long *)&function_name_local->size = *(long *)&function_name_local->size + 1;
              function_2.field_1._5_1_ = *(byte *)(*(long *)&function_name_local->size + -1);
              if (function_2.field_1._6_1_ == '\0') {
                (*(ch_upvalue ***)(aVar12.object_value + 4))[(byte)function_2.field_1._7_1_] =
                     *(ch_upvalue **)
                      (*(long *)(*(long *)(function_name_local +
                                          (ulong)(*(int *)&function_name_local[0x102].value - 1) + 3
                                          ) + 0x10) + (ulong)(byte)function_2.field_1._5_1_ * 8);
              }
              else {
                function_2.field_1._0_4_ =
                     function_name_local[(ulong)(*(int *)&function_name_local[0x102].value - 1) + 2]
                     .size + (uint)(byte)function_2.field_1._5_1_;
                pcVar13 = ch_stack_get((ch_stack *)&function_name_local[1].value,
                                       function_2.field_1._0_4_);
                pcVar14 = capture_upvalue((ch_context *)pcVar11,pcVar13);
                (*(ch_upvalue ***)(aVar12.object_value + 4))[(byte)function_2.field_1._7_1_] =
                     pcVar14;
              }
            }
          }
          else {
            halt((ch_context *)function_name_local,EXIT_STACK_SIZE_EXCEEDED);
          }
        }
      }
      else {
        halt((ch_context *)function_name_local,EXIT_STACK_EMPTY);
      }
      break;
    default:
      ch_runtime_error((ch_context *)function_name_local,EXIT_UNKNOWN_INSTRUCTION,
                       "Unknown instruction.");
    }
  }
  if (function_name_local[0x102].size == 1) {
    printf("Program has halted.\n");
  }
  else {
    printf("Runtime error: %d.\n",(ulong)function_name_local[0x102].size);
  }
  cVar16._0_8_ = *(ulong *)(function_name_local + 0x106) & 0xffffffff;
  cVar16.field_1 =
       (anon_union_8_4_dd993ae3_for_ch_primitive_1)
       (anon_union_8_4_dd993ae3_for_ch_primitive_1)function_name_local[0x106].value;
  return cVar16;
}

Assistant:

ch_primitive ch_vm_call(ch_context *context, ch_string *function_name) {
  size_t initial_stack_size = context->stack.size;

  while (context->exit == RUNNING) {
    uint8_t opcode = *(context->pcurrent);
    context->pcurrent++;

    switch (opcode) {
    case OP_NUMBER: {
      double value = LOAD_NUMBER(context, VM_READ_PTR(context));
      STACK_PUSH(context, MAKE_NUMBER(value));
      break;
    }
    case OP_STRING: {
      ch_string* string = read_string(context);
      STACK_PUSH(context, MAKE_OBJECT(string));
      break;
    }
    case OP_FALSE: { 
      STACK_PUSH(context, MAKE_BOOLEAN(false));
      break;
    }
    case OP_TRUE: { 
      STACK_PUSH(context, MAKE_BOOLEAN(true));
      break;
    }
    case OP_CHAR: {
      char value = VM_READ_CHAR(context);
      STACK_PUSH(context, MAKE_CHAR(value));
      break;
    }
    case OP_NULL: {
      STACK_PUSH(context, MAKE_NULL());
      break;
    }
    case OP_ADD: 
    case OP_SUB:
    case OP_MUL:
    case OP_DIV: {
      ch_primitive args[2];
      binary_op_args(context, args);

      if (args[0].type != args[1].type) {
        ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Can only apply binary operator on matching types.");
        break;
      }

      ch_primitive result;
      if (IS_NUMBER(args[0])) {
        STACK_PUSH(context, binary_op_number(context, args, opcode));
        break;
      }

      if (IS_OBJECT(args[0])) {
        ch_object* object_args[2] = {AS_OBJECT(args[0]), AS_OBJECT(args[1])};
        if (object_args[0]->type != object_args[1]->type) {
          ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Can only apply binary operator on matching object types.");
          break;
        }

        if (IS_STRING(object_args[0])) {
          STACK_PUSH(context, binary_op_string(context, object_args, opcode));
          break;
        }

        ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Cannot apply binary operation to object type: %d", object_args[0]->type);
        break;
      }

      ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Cannot apply binary operation to primitive type: %d", args[0].type);
      break;
    }
    case OP_ADDONE:
    case OP_SUBONE: {
      ch_primitive entry;
      STACK_POP(context, &entry);
      if (!IS_NUMBER(entry)) {
        ch_runtime_error(context, EXIT_INCORRECT_TYPE, "Expected number for addone, subone op");
        break;
      }

      double value;
      if (opcode == OP_ADDONE) {
        value = AS_NUMBER(entry) + 1;
      } else {
        value = AS_NUMBER(entry) - 1;
      }

      STACK_PUSH(context, MAKE_NUMBER(value));
      break;
    }
    case OP_NEGATE: {
      ch_primitive entry;
      STACK_POP(context, &entry);

      double value;
      if(ch_checknumber(context, entry, &value)) {
        STACK_PUSH(context, MAKE_NUMBER(-value));
      }
      break;
    }
    case OP_HALT: {
      context->exit = EXIT_OK;
      break;
    }
    case OP_POP: {
      ch_primitive entry;
      STACK_POP(context, &entry);
      break;
    }
    case OP_POPN: {
      ch_dataptr num_popped = VM_READ_PTR(context);

      // TODO add runtime check?
      ch_stack_popn(&context->stack, num_popped);
      break;
    }
    case OP_TOP: {
      ch_stack_copy(&context->stack, CH_STACK_ADDR(&context->stack) - 1);
      break;
    }
    case OP_LOAD_LOCAL: {
      uint8_t offset = (uint8_t)VM_READ_PTR(context);
      ch_stack_addr index = CURRENT_CALL(context).stack_addr + offset;
      ch_stack_copy(&context->stack, index);
      break;
    }
    case OP_SET_LOCAL: {
      ch_primitive entry;
      STACK_POP(context, &entry);

      uint8_t offset = (uint8_t)VM_READ_PTR(context);
      ch_stack_addr index = CURRENT_CALL(context).stack_addr + offset;

      ch_stack_set(&context->stack, index, entry);
      break;
    }
    case OP_LOAD_UPVALUE: {
      uint8_t index = VM_READ_ARGCOUNT(context);
      ch_primitive* value = CURRENT_CALL(context).closure->upvalues[index]->value;
      STACK_PUSH(context, *value);
      break;
    }
    case OP_SET_UPVALUE: {
      uint8_t index = VM_READ_ARGCOUNT(context);
      ch_primitive value;
      STACK_POP(context, &value);

      *CURRENT_CALL(context).closure->upvalues[index]->value = value;
      break;
    }
    case OP_CLOSE_UPVALUE: {
      ch_primitive* closed = ch_stack_get(&context->stack, context->stack.size - 1);
      close_upvalues(context, closed);
      ch_stack_popn(&context->stack, 1);
      break;
    }
    case OP_DEFINE_GLOBAL:
    case OP_SET_GLOBAL: {
      ch_string *name = read_string(context);

      ch_primitive entry;
      STACK_POP(context, &entry);

      set_global(context, name, entry, opcode == OP_SET_GLOBAL ? REDEFINE_GLOBAL : CREATE_GLOBAL);

      break;
    }
    case OP_LOAD_GLOBAL: {
      ch_string *name = read_string(context);
      get_global(context, name);
      break;
    }
    case OP_FUNCTION: {
      ch_dataptr function_ptr = VM_READ_PTR(context);
      ch_argcount argcount = VM_READ_ARGCOUNT(context);
      ch_primitive function =
          MAKE_OBJECT(ch_loadfunction(function_ptr, argcount));
      STACK_PUSH(context, function);
      break;
    }
    case OP_CLOSURE: {
      uint8_t upvalue_count = VM_READ_ARGCOUNT(context);
      ch_primitive value;
      STACK_POP(context, &value);
      ch_function* function = NULL;
      if(!ch_checkfunction(context, value, &function)) break;

      ch_closure* closure = ch_loadclosure(function, upvalue_count);
      STACK_PUSH(context, MAKE_OBJECT(closure));

      for(uint8_t i = 0; i < upvalue_count; i++) {
        uint8_t is_local = VM_READ_ARGCOUNT(context);
        uint8_t index = VM_READ_ARGCOUNT(context);

        if (is_local) {
          ch_stack_addr addr = CURRENT_CALL(context).stack_addr + index;
          closure->upvalues[i] = capture_upvalue(context, ch_stack_get(&context->stack, addr));
        } else {
          closure->upvalues[i] = CURRENT_CALL(context).closure->upvalues[index];
        }
      }
      break;
    }
    case OP_BEGIN: {
      get_global(context, function_name);
      ch_primitive function;
      STACK_POP(context, &function);

      try_call(context, function, initial_stack_size);
      break;
    }
    case OP_CALL: {
      ch_argcount argcount = VM_READ_ARGCOUNT(context);

      ch_primitive function;
      STACK_POP(context, &function);

      try_call(context, function, argcount);
      break;
    }
    case OP_RETURN_VALUE: {
      ch_primitive returned_value;
      STACK_POP(context, &returned_value);

      call_return(context);

      // Check if we are returning from the main function
      if (context->call_stack.size != 0) {
        STACK_PUSH(context, returned_value);
      } else {
        context->program_return_value = returned_value;
      }

      break;
    }
    case OP_RETURN_VOID: {
      call_return(context);
      break;
    }
    case OP_JMP: {
      ch_jmpptr ptr = VM_READ_JMPPTR(context);
      jump(context, ptr);
      break;
    }
    case OP_JMP_FALSE: {
      ch_jmpptr ptr = VM_READ_JMPPTR(context);

      ch_primitive peek = ch_stack_peek(&context->stack, 0);

      if (ch_primitive_isfalsy(peek)) {
        jump(context, ptr);
      }
      break;
    }
    default: {
      ch_runtime_error(context, EXIT_UNKNOWN_INSTRUCTION,
                       "Unknown instruction.");
      break;
    }
    }
  }

  if (context->exit != EXIT_OK) {
    printf("Runtime error: %d.\n", context->exit);
  } else {
    printf("Program has halted.\n");
  }

  return context->program_return_value;
}